

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsViewPrivate::populateSceneDragDropEvent
          (QGraphicsViewPrivate *this,QGraphicsSceneDragDropEvent *dest,QDropEvent *source)

{
  long lVar1;
  QWidget *this_00;
  QDropEvent *in_RDX;
  QPoint *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *q;
  undefined4 in_stack_ffffffffffffff18;
  DropAction in_stack_ffffffffffffff1c;
  QWidget *this_01;
  QFlagsStorage<Qt::DropAction> actions;
  QPointF *in_stack_ffffffffffffff30;
  QPoint *in_stack_ffffffffffffff40;
  QGraphicsView *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(in_RDI);
  this_01 = this_00;
  QDropEvent::position((QDropEvent *)in_RSI);
  QPointF::toPoint(in_stack_ffffffffffffff30);
  QGraphicsView::mapToScene(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  QGraphicsSceneDragDropEvent::setScenePos
            ((QGraphicsSceneDragDropEvent *)this_01,
             (QPointF *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QDropEvent::position((QDropEvent *)in_RSI);
  QPointF::toPoint((QPointF *)this_00);
  QWidget::mapToGlobal(this_00,in_RSI);
  actions.i = (Int)((ulong)in_RSI >> 0x20);
  QGraphicsSceneDragDropEvent::setScreenPos
            ((QGraphicsSceneDragDropEvent *)this_01,
             (QPoint *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QDropEvent::buttons((QDropEvent *)this_01);
  QGraphicsSceneDragDropEvent::setButtons
            ((QGraphicsSceneDragDropEvent *)this_01,(MouseButtons)actions.i);
  QDropEvent::modifiers((QDropEvent *)this_01);
  QGraphicsSceneDragDropEvent::setModifiers
            ((QGraphicsSceneDragDropEvent *)this_01,(KeyboardModifiers)actions.i);
  QDropEvent::possibleActions((QDropEvent *)this_01);
  QGraphicsSceneDragDropEvent::setPossibleActions
            ((QGraphicsSceneDragDropEvent *)this_01,(DropActions)actions.i);
  QDropEvent::proposedAction(in_RDX);
  QGraphicsSceneDragDropEvent::setProposedAction
            ((QGraphicsSceneDragDropEvent *)this_01,in_stack_ffffffffffffff1c);
  QDropEvent::dropAction(in_RDX);
  QGraphicsSceneDragDropEvent::setDropAction
            ((QGraphicsSceneDragDropEvent *)this_01,in_stack_ffffffffffffff1c);
  QDropEvent::mimeData(in_RDX);
  QGraphicsSceneDragDropEvent::setMimeData
            ((QGraphicsSceneDragDropEvent *)this_01,
             (QMimeData *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QGraphicsSceneEvent::setWidget
            ((QGraphicsSceneEvent *)this_01,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QDropEvent::source();
  qobject_cast<QWidget*>((QObject *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QGraphicsSceneDragDropEvent::setSource
            ((QGraphicsSceneDragDropEvent *)this_01,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::populateSceneDragDropEvent(QGraphicsSceneDragDropEvent *dest,
                                                      QDropEvent *source)
{
#if QT_CONFIG(draganddrop)
    Q_Q(QGraphicsView);
    dest->setScenePos(q->mapToScene(source->position().toPoint()));
    dest->setScreenPos(q->mapToGlobal(source->position().toPoint()));
    dest->setButtons(source->buttons());
    dest->setModifiers(source->modifiers());
    dest->setPossibleActions(source->possibleActions());
    dest->setProposedAction(source->proposedAction());
    dest->setDropAction(source->dropAction());
    dest->setMimeData(source->mimeData());
    dest->setWidget(viewport);
    dest->setSource(qobject_cast<QWidget *>(source->source()));
#else
    Q_UNUSED(dest);
    Q_UNUSED(source);
#endif
}